

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template-parser.c
# Opt level: O0

void blogc_template_free_ast(bc_slist_t *ast)

{
  char *__ptr;
  blogc_template_node_t *data;
  bc_slist_t *tmp;
  bc_slist_t *ast_local;
  
  for (data = (blogc_template_node_t *)ast; data != (blogc_template_node_t *)0x0;
      data = *(blogc_template_node_t **)data) {
    __ptr = data->data[0];
    if (__ptr != (char *)0x0) {
      free(*(void **)(__ptr + 8));
      free(*(void **)(__ptr + 0x10));
      free(__ptr);
    }
  }
  bc_slist_free(ast);
  return;
}

Assistant:

void
blogc_template_free_ast(bc_slist_t *ast)
{
    for (bc_slist_t *tmp = ast; tmp != NULL; tmp = tmp->next) {
        blogc_template_node_t *data = tmp->data;
        if (data == NULL)
            continue;
        free(data->data[0]);
        free(data->data[1]);
        free(data);
    }
    bc_slist_free(ast);
}